

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barray.c
# Opt level: O2

int bit_array_test_range(void *array,size_t bit,size_t count)

{
  ulong uVar1;
  size_t sVar2;
  ulong uVar3;
  bool bVar4;
  
  if ((array != (void *)0x0) && (uVar1 = *array, bit < uVar1)) {
    sVar2 = bit;
    if (8 < count && (bit & 7) != 0) {
      uVar3 = (-(int)bit & 7) + bit;
      while( true ) {
        sVar2 = bit;
        if (((uVar1 <= bit) || (count == 0)) || (sVar2 = uVar3, (bit & 7) == 0)) break;
        if ((*(byte *)((long)array + (bit >> 3) + 8) >> (int)(bit & 7) & 1) != 0) {
          return 1;
        }
        bit = bit + 1;
        count = count - 1;
      }
    }
    if ((sVar2 & 7) == 0) {
      uVar3 = uVar1 - sVar2;
      for (; (7 < uVar3 && (7 < count)); count = count - 8) {
        if (*(char *)((long)array + (sVar2 >> 3) + 8) != '\0') {
          return 1;
        }
        sVar2 = sVar2 + 8;
        uVar3 = uVar3 - 8;
      }
    }
    while( true ) {
      bVar4 = count == 0;
      count = count - 1;
      if ((uVar1 <= sVar2) || (bVar4)) break;
      if ((*(byte *)((long)array + (sVar2 >> 3) + 8) >> ((uint)sVar2 & 7) & 1) != 0) {
        return 1;
      }
      sVar2 = sVar2 + 1;
    }
  }
  return 0;
}

Assistant:

int bit_array_test_range(void * array, size_t bit, size_t count)
{
	if (array)
	{
		size_t * size = (size_t *) array;
		if (bit < *size)
		{
			unsigned char * ptr = (unsigned char *)(size + 1);
			if ((bit & 7) && (count > 8))
			{
				while ((bit < *size) && count && (bit & 7))
				{
					if (ptr[bit >> 3] & (1U << (bit & 7))) return 1;
					bit++;
					count--;
				}
			}
			if (!(bit & 7))
			{
				while (((*size - bit) >= 8) && (count >= 8))
				{
					if (ptr[bit >> 3]) return 1;
					bit += 8;
					count -= 8;
				}
			}
			while ((bit < *size) && count)
			{
				if (ptr[bit >> 3] & (1U << (bit & 7))) return 1;
				bit++;
				count--;
			}
		}
	}
	return 0;
}